

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O0

float query_decision(active *a,float ec_revert_weight,float k)

{
  double dVar1;
  long in_RDI;
  float fVar2;
  double dVar3;
  float in_XMM1_Da;
  float unaff_retaddr;
  float weighted_queries;
  float avg_loss;
  float bias;
  uint64_t *in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  float in_stack_fffffffffffffff8;
  float in_stack_fffffffffffffffc;
  
  if (1.0 < in_XMM1_Da) {
    dVar1 = *(double *)(**(long **)(in_RDI + 8) + 0x20);
    in_stack_ffffffffffffffd0 =
         (uint64_t *)(*(double *)(**(long **)(in_RDI + 8) + 0x40) / (double)in_XMM1_Da);
    dVar3 = std::log((double)(ulong)(uint)in_XMM1_Da);
    fVar2 = (float)((ulong)in_RDI >> 0x20);
    sqrt(((double)SUB84(dVar3,0) * 0.5 + 1.0) / ((double)(float)dVar1 + 0.0001));
    local_1c = get_active_coin_bias
                         (unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,fVar2);
  }
  else {
    local_1c = 1.0;
  }
  fVar2 = merand48(in_stack_ffffffffffffffd0);
  if (local_1c <= fVar2) {
    local_1c = -1.0;
  }
  else {
    local_1c = 1.0 / local_1c;
  }
  return local_1c;
}

Assistant:

float query_decision(active& a, float ec_revert_weight, float k)
{
  float bias, avg_loss, weighted_queries;
  if (k <= 1.)
    bias = 1.;
  else
  {
    weighted_queries = (float)a.all->sd->weighted_labeled_examples;
    avg_loss = (float)(a.all->sd->sum_loss / k + sqrt((1. + 0.5 * log(k)) / (weighted_queries + 0.0001)));
    bias = get_active_coin_bias(k, avg_loss, ec_revert_weight / k, a.active_c0);
  }
  if (merand48(a.all->random_state) < bias)
    return 1.f / bias;
  else
    return -1.;
}